

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O3

void pzshape::TPZShapeDisc::Legendre
               (REAL C,REAL x0,REAL x,int degree,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi,
               int n)

{
  ulong uVar1;
  double dVar2;
  long lVar3;
  ulong uVar4;
  uint num;
  long lVar5;
  ulong uVar6;
  REAL val;
  double local_38;
  
  num = degree + 1;
  (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (phi,(long)(int)num,1);
  (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (dphi,(long)n,(long)(int)num);
  TPZShapeLinear::Legendre((x - x0) / C,num,phi,dphi,n);
  if (-1 < degree) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      if (0 < n) {
        uVar6 = 0;
        do {
          lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar3 <= (long)uVar6) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar4)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dVar2 = *(double *)((long)dphi->fElem + uVar6 * 8 + lVar3 * lVar5);
          uVar1 = uVar6 + 1;
          local_38 = pow(C,(double)(int)uVar1);
          local_38 = dVar2 / local_38;
          (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x20])(dphi,uVar6,uVar4,&local_38);
          uVar6 = uVar1;
        } while (uVar1 != (uint)n);
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 8;
    } while (uVar4 != num);
  }
  return;
}

Assistant:

void TPZShapeDisc::Legendre(REAL C,REAL x0,REAL x,int degree,TPZFMatrix<REAL> & phi,TPZFMatrix<REAL> & dphi, int n){
#ifdef PZDEBUG
  if(IsZero(C)){
    DebugStop();
  }
#endif

   x = (x - x0) / C;
   phi.Redim(degree+1,1);
   dphi.Redim(n,degree+1);

   TPZShapeLinear::Legendre(x, degree+1, phi, dphi, n);

   REAL val;
   for(int ord = 0; ord < degree+1; ord++)
      for (int ideriv = 0; ideriv < n; ideriv++){
	 val = dphi(ideriv, ord) / pow(C, ideriv+1);
	 dphi.Put(ideriv, ord, val);
      }

}